

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

void * PololuThread(void *pParam)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  CRITICAL_SECTION *__mutex;
  long lVar7;
  byte bVar8;
  int value;
  long local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  int pws [24];
  int selectedchannels [24];
  
  bVar8 = 0;
  value = 0;
  __mutex = PololuCS;
  lVar7 = 0;
  lVar5 = 0;
  do {
    if (*(void **)((long)addrsPololu + lVar7 * 2) == pParam) {
      valuesPololu[0][0x14] = 0;
      valuesPololu[0][0x15] = 0;
      valuesPololu[0][0x16] = 0;
      valuesPololu[0][0x17] = 0;
      valuesPololu[0][0x10] = 0;
      valuesPololu[0][0x11] = 0;
      valuesPololu[0][0x12] = 0;
      valuesPololu[0][0x13] = 0;
      valuesPololu[0][0xc] = 0;
      valuesPololu[0][0xd] = 0;
      valuesPololu[0][0xe] = 0;
      valuesPololu[0][0xf] = 0;
      valuesPololu[0][8] = 0;
      valuesPololu[0][9] = 0;
      valuesPololu[0][10] = 0;
      valuesPololu[0][0xb] = 0;
      valuesPololu[0][4] = 0;
      valuesPololu[0][5] = 0;
      valuesPololu[0][6] = 0;
      valuesPololu[0][7] = 0;
      valuesPololu[0][0] = 0;
      valuesPololu[0][1] = 0;
      valuesPololu[0][2] = 0;
      valuesPololu[0][3] = 0;
      mSleep((long)*(int *)((long)pParam + 0x5e8));
      local_100 = (undefined8 *)((long)selectedchannelsPololu[0] + lVar5);
      local_108 = (undefined8 *)((long)pwsPololu[0] + lVar5);
      iVar6 = 0;
      local_110 = lVar5;
      do {
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        lVar5 = 0xc;
        puVar3 = local_100;
        piVar4 = selectedchannels;
        for (lVar2 = lVar5; lVar2 != 0; lVar2 = lVar2 + -1) {
          *(undefined8 *)piVar4 = *puVar3;
          puVar3 = puVar3 + (ulong)bVar8 * -2 + 1;
          piVar4 = piVar4 + (ulong)bVar8 * -4 + 2;
        }
        puVar3 = local_108;
        piVar4 = pws;
        for (; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(undefined8 *)piVar4 = *puVar3;
          puVar3 = puVar3 + (ulong)bVar8 * -2 + 1;
          piVar4 = piVar4 + (ulong)bVar8 * -4 + 2;
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        iVar1 = SetAllPWMsPololu((POLOLU *)pParam,selectedchannels,pws);
        if (iVar1 != 0) {
          iVar6 = iVar1;
        }
        mSleep(10);
        lVar5 = local_110;
        if (*(int *)((long)pParam + 0x1188) != -1) {
          value = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1188),&value);
          if (iVar1 != 0) {
            iVar6 = iVar1;
          }
          mSleep(10);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          lVar5 = local_110;
          *(int *)((long)valuesPololu[0] + local_110 + (long)*(int *)((long)pParam + 0x1188) * 4) =
               value;
          *(int *)((long)resPololu + lVar7) = iVar6;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x118c) != -1) {
          value = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x118c),&value);
          if (iVar1 != 0) {
            iVar6 = iVar1;
          }
          mSleep(10);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar5 + (long)*(int *)((long)pParam + 0x118c) * 4) =
               value;
          *(int *)((long)resPololu + lVar7) = iVar6;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x1190) != -1) {
          value = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1190),&value);
          if (iVar1 != 0) {
            iVar6 = iVar1;
          }
          mSleep(10);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar5 + (long)*(int *)((long)pParam + 0x1190) * 4) =
               value;
          *(int *)((long)resPololu + lVar7) = iVar6;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x1194) != -1) {
          value = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1194),&value);
          if (iVar1 != 0) {
            iVar6 = iVar1;
          }
          mSleep(10);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar5 + (long)*(int *)((long)pParam + 0x1194) * 4) =
               value;
          *(int *)((long)resPololu + lVar7) = iVar6;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x1198) != -1) {
          value = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x1198),&value);
          if (iVar1 != 0) {
            iVar6 = iVar1;
          }
          mSleep(10);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar5 + (long)*(int *)((long)pParam + 0x1198) * 4) =
               value;
          *(int *)((long)resPololu + lVar7) = iVar6;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x119c) != -1) {
          value = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x119c),&value);
          if (iVar1 != 0) {
            iVar6 = iVar1;
          }
          mSleep(10);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar5 + (long)*(int *)((long)pParam + 0x119c) * 4) =
               value;
          *(int *)((long)resPololu + lVar7) = iVar6;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (*(int *)((long)pParam + 0x11a0) != -1) {
          value = 0;
          iVar1 = GetValuePololu((POLOLU *)pParam,*(int *)((long)pParam + 0x11a0),&value);
          if (iVar1 != 0) {
            iVar6 = iVar1;
          }
          mSleep(10);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          *(int *)((long)valuesPololu[0] + lVar5 + (long)*(int *)((long)pParam + 0x11a0) * 4) =
               value;
          *(int *)((long)resPololu + lVar7) = iVar6;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        *(int *)((long)resPololu + lVar7) = iVar6;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitPololu + lVar7) == 0);
      return (void *)0x0;
    }
    lVar5 = lVar5 + 0x60;
    __mutex = __mutex + 1;
    lVar7 = lVar7 + 4;
  } while (lVar5 != 0x600);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE PololuThread(void* pParam)
{
	POLOLU* pPololu = (POLOLU*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	int selectedchannels[NB_CHANNELS_PWM_POLOLU];
	int pws[NB_CHANNELS_PWM_POLOLU];
	int value = 0;

	while (addrsPololu[id] != pPololu)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(valuesPololu, 0, NB_CHANNELS_POLOLU*sizeof(int));
	
	mSleep(pPololu->threadperiod);

	for (;;)
	{
		EnterCriticalSection(&PololuCS[id]);
		memcpy(selectedchannels, selectedchannelsPololu[id], NB_CHANNELS_PWM_POLOLU*sizeof(int));
		memcpy(pws, pwsPololu[id], NB_CHANNELS_PWM_POLOLU*sizeof(int));
		LeaveCriticalSection(&PololuCS[id]);
		res = SetAllPWMsPololu(pPololu, selectedchannels, pws);
		if (res != EXIT_SUCCESS) err = res;
		mSleep(10);
		if (pPololu->winddiranaloginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->winddiranaloginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->winddiranaloginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->windspeedanaloginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->windspeedanaloginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->windspeedanaloginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->vbat1analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->vbat1analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->vbat1analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->ibat1analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->ibat1analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->ibat1analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->vbat2analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->vbat2analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->vbat2analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->ibat2analoginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->ibat2analoginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->ibat2analoginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		if (pPololu->switchanaloginputchan != -1)
		{
			value = 0;
			res = GetValuePololu(pPololu, pPololu->switchanaloginputchan, &value);
			if (res != EXIT_SUCCESS) err = res;
			mSleep(10);
			EnterCriticalSection(&PololuCS[id]);
			valuesPololu[id][pPololu->switchanaloginputchan] = value;
			resPololu[id] = err;
			LeaveCriticalSection(&PololuCS[id]);
		}
		//else mSleep(10);
		EnterCriticalSection(&PololuCS[id]);
		resPololu[id] = err;
		LeaveCriticalSection(&PololuCS[id]);
		if (bExitPololu[id]) break;
	}

	return 0;
}